

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoncentralAbsoluteAdapter.cpp
# Opt level: O0

void __thiscall
opengv::absolute_pose::NoncentralAbsoluteAdapter::NoncentralAbsoluteAdapter
          (NoncentralAbsoluteAdapter *this,bearingVectors_t *bearingVectors,
          camCorrespondences_t *camCorrespondences,points_t *points,translations_t *camOffsets,
          rotations_t *camRotations,rotation_t *R)

{
  undefined8 in_RCX;
  rotation_t *in_RDX;
  AbsoluteAdapterBase *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  
  AbsoluteAdapterBase::AbsoluteAdapterBase(in_RSI,in_RDX);
  *in_RDI = &PTR__NoncentralAbsoluteAdapter_00c12b98;
  in_RDI[0xd] = in_RSI;
  in_RDI[0xe] = in_RDX;
  in_RDI[0xf] = in_RCX;
  in_RDI[0x10] = in_R8;
  in_RDI[0x11] = in_R9;
  return;
}

Assistant:

opengv::absolute_pose::NoncentralAbsoluteAdapter::NoncentralAbsoluteAdapter(
    const bearingVectors_t & bearingVectors,
    const camCorrespondences_t & camCorrespondences,
    const points_t & points,
    const translations_t & camOffsets,
    const rotations_t & camRotations,
    const rotation_t & R ) :
    AbsoluteAdapterBase(R),
    _bearingVectors(bearingVectors),
    _camCorrespondences(camCorrespondences),
    _points(points),
    _camOffsets(camOffsets),
    _camRotations(camRotations)
{}